

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_exception_primitive_printString
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_exception_t *exceptionObject;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  if (*(long *)(*arguments + 0x10) == 0) {
    context_local = (sysbvm_context_t *)sysbvm_string_createWithCString(context,"An exception");
  }
  else {
    context_local = *(sysbvm_context_t **)(*arguments + 0x10);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_exception_primitive_printString(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_exception_t *exceptionObject = (sysbvm_exception_t*)arguments[0];
    if(exceptionObject->messageText)
        return exceptionObject->messageText;

    return sysbvm_string_createWithCString(context, "An exception");
}